

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::RemoveExportBuildFileGeneratorCMP0024(cmMakefile *this,cmExportBuildFileGenerator *gen)

{
  bool bVar1;
  const_iterator local_48;
  __normal_iterator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_*,_std::vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>_>
  local_40;
  unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_> *local_38
  ;
  unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_> *local_30
  ;
  __normal_iterator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_*,_std::vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>_>
  local_28;
  __normal_iterator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_*,_std::vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>_>
  local_20;
  __normal_iterator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_*,_std::vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>_>
  it;
  cmExportBuildFileGenerator *gen_local;
  cmMakefile *this_local;
  
  it._M_current =
       (unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_> *)
       gen;
  local_28._M_current =
       (unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_> *)
       std::
       vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
       ::begin(&this->ExportBuildFileGenerators);
  local_30 = (unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
              *)std::
                vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
                ::end(&this->ExportBuildFileGenerators);
  local_38 = it._M_current;
  local_20 = std::
             find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>*,std::vector<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>,std::allocator<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>>>>,cmMakefile::RemoveExportBuildFileGeneratorCMP0024(cmExportBuildFileGenerator*)::__0>
                       (local_28,(__normal_iterator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_*,_std::vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>_>
                                  )local_30,(anon_class_8_1_ba1d4ab0_for__M_pred)it._M_current);
  local_40._M_current =
       (unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_> *)
       std::
       vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
       ::end(&this->ExportBuildFileGenerators);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_40);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>const*,std::vector<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>,std::allocator<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>>>>
    ::
    __normal_iterator<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>*>
              ((__normal_iterator<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>const*,std::vector<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>,std::allocator<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>>>>
                *)&local_48,&local_20);
    std::
    vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
    ::erase(&this->ExportBuildFileGenerators,local_48);
  }
  return;
}

Assistant:

void cmMakefile::RemoveExportBuildFileGeneratorCMP0024(
  cmExportBuildFileGenerator* gen)
{
  auto it =
    std::find_if(this->ExportBuildFileGenerators.begin(),
                 this->ExportBuildFileGenerators.end(),
                 [gen](std::unique_ptr<cmExportBuildFileGenerator> const& p) {
                   return p.get() == gen;
                 });
  if (it != this->ExportBuildFileGenerators.end()) {
    this->ExportBuildFileGenerators.erase(it);
  }
}